

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int testC(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_State *L1;
  char *pc;
  
  iVar2 = 1;
  iVar1 = lua_isuserdata(L,1);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,1);
    L1 = L;
    if (iVar1 != 8) goto LAB_001499ab;
    L1 = lua_tothread(L,1);
  }
  else {
    L1 = getstate(L);
  }
  iVar2 = 2;
LAB_001499ab:
  pc = luaL_checklstring(L,iVar2,(size_t *)0x0);
  iVar2 = runC(L,L1,pc);
  return iVar2;
}

Assistant:

static int testC (lua_State *L) {
  lua_State *L1;
  const char *pc;
  if (lua_isuserdata(L, 1)) {
    L1 = getstate(L);
    pc = luaL_checkstring(L, 2);
  }
  else if (lua_isthread(L, 1)) {
    L1 = lua_tothread(L, 1);
    pc = luaL_checkstring(L, 2);
  }
  else {
    L1 = L;
    pc = luaL_checkstring(L, 1);
  }
  return runC(L, L1, pc);
}